

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Joystick.hpp
# Opt level: O0

void __thiscall Inputs::ConcreteJoystick::set_input(ConcreteJoystick *this,Input *input,float value)

{
  bool bVar1;
  reference pvVar2;
  Input local_60;
  Input local_50;
  Input local_40;
  Input local_30;
  float local_1c;
  Input *pIStack_18;
  float value_local;
  Input *input_local;
  ConcreteJoystick *this_local;
  
  local_1c = value;
  pIStack_18 = input;
  input_local = (Input *)this;
  bVar1 = Inputs::Joystick::Input::is_button(input);
  if ((!bVar1) &&
     (pvVar2 = std::
               vector<Inputs::ConcreteJoystick::StickType,_std::allocator<Inputs::ConcreteJoystick::StickType>_>
               ::operator[](&this->stick_types_,(size_type)pIStack_18->info), *pvVar2 == Analogue))
  {
    (*(this->super_Joystick)._vptr_Joystick[7])(local_1c,this,pIStack_18);
    return;
  }
  if (pIStack_18->type == Horizontal) {
    Inputs::Joystick::Input::Input(&local_30,Left,(size_t)pIStack_18->info);
    (*(this->super_Joystick)._vptr_Joystick[8])(this,&local_30,(ulong)(local_1c <= 0.25));
    Inputs::Joystick::Input::Input(&local_40,Right,(size_t)pIStack_18->info);
    (*(this->super_Joystick)._vptr_Joystick[8])(this,&local_40,(ulong)(0.75 <= local_1c));
  }
  else if (pIStack_18->type == Vertical) {
    Inputs::Joystick::Input::Input(&local_50,Up,(size_t)pIStack_18->info);
    (*(this->super_Joystick)._vptr_Joystick[8])(this,&local_50,(ulong)(local_1c <= 0.25));
    Inputs::Joystick::Input::Input(&local_60,Down,(size_t)pIStack_18->info);
    (*(this->super_Joystick)._vptr_Joystick[8])(this,&local_60,(ulong)(0.75 <= local_1c));
  }
  else {
    (*(this->super_Joystick)._vptr_Joystick[8])(this,pIStack_18,(ulong)(0.5 < local_1c));
  }
  return;
}

Assistant:

void set_input(const Input &input, float value) final {
			// If this is an analogue setting to an analogue property, just pass it along.
			if(!input.is_button() && stick_types_[input.info.control.index] == StickType::Analogue) {
				did_set_input(input, value);
				return;
			}

			// Otherwise apply a threshold test to convert to digital, with remapping from axes to digital inputs.
			using Type = Joystick::Input::Type;
			switch(input.type) {
				default:			did_set_input(input, value > 0.5f);											break;
				case Type::Horizontal:
					did_set_input(Input(Type::Left, input.info.control.index), value <= 0.25f);
					did_set_input(Input(Type::Right, input.info.control.index), value >= 0.75f);
				break;
				case Type::Vertical:
					did_set_input(Input(Type::Up, input.info.control.index), value <= 0.25f);
					did_set_input(Input(Type::Down, input.info.control.index), value >= 0.75f);
				break;
			}
		}